

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

void N_VLinearSum_Serial(sunrealtype a,N_Vector x,sunrealtype b,N_Vector y,N_Vector z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  sunindextype N;
  sunrealtype *xd;
  N_Vector p_Var7;
  N_Vector p_Var8;
  long lVar9;
  
  if (z == y && b == 1.0) {
    Vaxpy_Serial(a,x,y);
    return;
  }
  if (z != x || a != 1.0) {
    if ((((a != 1.0) || (NAN(a))) || (b != 1.0)) || (NAN(b))) {
      if ((((a == 1.0) && (!NAN(a))) && ((b == -1.0 && (p_Var7 = x, p_Var8 = y, !NAN(b))))) ||
         (((a == -1.0 && (!NAN(a))) && ((b == 1.0 && (p_Var7 = y, p_Var8 = x, !NAN(b))))))) {
        lVar1 = *p_Var7->content;
        if (0 < lVar1) {
          lVar2 = *(long *)((long)p_Var7->content + 0x10);
          lVar3 = *(long *)((long)p_Var8->content + 0x10);
          lVar4 = *(long *)((long)z->content + 0x10);
          lVar9 = 0;
          do {
            *(double *)(lVar4 + lVar9 * 8) =
                 *(double *)(lVar2 + lVar9 * 8) - *(double *)(lVar3 + lVar9 * 8);
            lVar9 = lVar9 + 1;
          } while (lVar1 != lVar9);
        }
      }
      else if (((a == 1.0) && (!NAN(a))) || ((b == 1.0 && (!NAN(b))))) {
        bVar5 = NAN(a);
        bVar6 = a == 1.0;
        if ((bVar6) && (!bVar5)) {
          a = b;
        }
        p_Var7 = y;
        if (!bVar6) {
          p_Var7 = x;
        }
        if (bVar5) {
          p_Var7 = x;
        }
        if (!bVar6) {
          x = y;
        }
        if (bVar5) {
          x = y;
        }
        lVar1 = *p_Var7->content;
        if (0 < lVar1) {
          lVar2 = *(long *)((long)p_Var7->content + 0x10);
          lVar3 = *(long *)((long)x->content + 0x10);
          lVar4 = *(long *)((long)z->content + 0x10);
          lVar9 = 0;
          do {
            *(double *)(lVar4 + lVar9 * 8) =
                 *(double *)(lVar2 + lVar9 * 8) * a + *(double *)(lVar3 + lVar9 * 8);
            lVar9 = lVar9 + 1;
          } while (lVar1 != lVar9);
        }
      }
      else if (((a == -1.0) && (!NAN(a))) || ((b == -1.0 && (!NAN(b))))) {
        bVar5 = NAN(a);
        bVar6 = a == -1.0;
        if ((bVar6) && (!bVar5)) {
          a = b;
        }
        p_Var7 = y;
        if (!bVar6) {
          p_Var7 = x;
        }
        if (bVar5) {
          p_Var7 = x;
        }
        if (!bVar6) {
          x = y;
        }
        if (bVar5) {
          x = y;
        }
        lVar1 = *p_Var7->content;
        if (0 < lVar1) {
          lVar2 = *(long *)((long)p_Var7->content + 0x10);
          lVar3 = *(long *)((long)x->content + 0x10);
          lVar4 = *(long *)((long)z->content + 0x10);
          lVar9 = 0;
          do {
            *(double *)(lVar4 + lVar9 * 8) =
                 *(double *)(lVar2 + lVar9 * 8) * a - *(double *)(lVar3 + lVar9 * 8);
            lVar9 = lVar9 + 1;
          } while (lVar1 != lVar9);
        }
      }
      else if ((a != b) || (NAN(a) || NAN(b))) {
        lVar1 = *x->content;
        lVar2 = *(long *)((long)x->content + 0x10);
        lVar3 = *(long *)((long)y->content + 0x10);
        lVar4 = *(long *)((long)z->content + 0x10);
        if ((-b != a) || (NAN(-b) || NAN(a))) {
          if (0 < lVar1) {
            lVar9 = 0;
            do {
              *(double *)(lVar4 + lVar9 * 8) =
                   *(double *)(lVar2 + lVar9 * 8) * a + *(double *)(lVar3 + lVar9 * 8) * b;
              lVar9 = lVar9 + 1;
            } while (lVar1 != lVar9);
          }
        }
        else if (0 < lVar1) {
          lVar9 = 0;
          do {
            *(double *)(lVar4 + lVar9 * 8) =
                 (*(double *)(lVar2 + lVar9 * 8) - *(double *)(lVar3 + lVar9 * 8)) * a;
            lVar9 = lVar9 + 1;
          } while (lVar1 != lVar9);
        }
      }
      else {
        lVar1 = *x->content;
        if (0 < lVar1) {
          lVar2 = *(long *)((long)x->content + 0x10);
          lVar3 = *(long *)((long)y->content + 0x10);
          lVar4 = *(long *)((long)z->content + 0x10);
          lVar9 = 0;
          do {
            *(double *)(lVar4 + lVar9 * 8) =
                 (*(double *)(lVar2 + lVar9 * 8) + *(double *)(lVar3 + lVar9 * 8)) * a;
            lVar9 = lVar9 + 1;
          } while (lVar1 != lVar9);
        }
      }
    }
    else {
      lVar1 = *x->content;
      if (0 < lVar1) {
        lVar2 = *(long *)((long)x->content + 0x10);
        lVar3 = *(long *)((long)y->content + 0x10);
        lVar4 = *(long *)((long)z->content + 0x10);
        lVar9 = 0;
        do {
          *(double *)(lVar4 + lVar9 * 8) =
               *(double *)(lVar2 + lVar9 * 8) + *(double *)(lVar3 + lVar9 * 8);
          lVar9 = lVar9 + 1;
        } while (lVar1 != lVar9);
      }
    }
    return;
  }
  Vaxpy_Serial(b,y,x);
  return;
}

Assistant:

void N_VLinearSum_Serial(sunrealtype a, N_Vector x, sunrealtype b, N_Vector y,
                         N_Vector z)
{
  sunindextype i, N;
  sunrealtype c, *xd, *yd, *zd;
  N_Vector v1, v2;
  sunbooleantype test;

  xd = yd = zd = NULL;

  if ((b == ONE) && (z == y))
  { /* BLAS usage: axpy y <- ax+y */
    Vaxpy_Serial(a, x, y);
    return;
  }

  if ((a == ONE) && (z == x))
  { /* BLAS usage: axpy x <- by+x */
    Vaxpy_Serial(b, y, x);
    return;
  }

  /* Case: a == b == 1.0 */

  if ((a == ONE) && (b == ONE))
  {
    VSum_Serial(x, y, z);
    return;
  }

  /* Cases: (1) a == 1.0, b = -1.0, (2) a == -1.0, b == 1.0 */

  if ((test = ((a == ONE) && (b == -ONE))) || ((a == -ONE) && (b == ONE)))
  {
    v1 = test ? y : x;
    v2 = test ? x : y;
    VDiff_Serial(v2, v1, z);
    return;
  }

  /* Cases: (1) a == 1.0, b == other or 0.0, (2) a == other or 0.0, b == 1.0 */
  /* if a or b is 0.0, then user should have called N_VScale */

  if ((test = (a == ONE)) || (b == ONE))
  {
    c  = test ? b : a;
    v1 = test ? y : x;
    v2 = test ? x : y;
    VLin1_Serial(c, v1, v2, z);
    return;
  }

  /* Cases: (1) a == -1.0, b != 1.0, (2) a != 1.0, b == -1.0 */

  if ((test = (a == -ONE)) || (b == -ONE))
  {
    c  = test ? b : a;
    v1 = test ? y : x;
    v2 = test ? x : y;
    VLin2_Serial(c, v1, v2, z);
    return;
  }

  /* Case: a == b */
  /* catches case both a and b are 0.0 - user should have called N_VConst */

  if (a == b)
  {
    VScaleSum_Serial(a, x, y, z);
    return;
  }

  /* Case: a == -b */

  if (a == -b)
  {
    VScaleDiff_Serial(a, x, y, z);
    return;
  }

  /* Do all cases not handled above:
     (1) a == other, b == 0.0 - user should have called N_VScale
     (2) a == 0.0, b == other - user should have called N_VScale
     (3) a,b == other, a !=b, a != -b */

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++) { zd[i] = (a * xd[i]) + (b * yd[i]); }

  return;
}